

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int cbs_get_length_prefixed(CBS *cbs,CBS *out,size_t len_len)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  
  uVar3 = cbs->len - len_len;
  if (cbs->len < len_len) {
    return 0;
  }
  puVar2 = cbs->data;
  puVar1 = puVar2 + len_len;
  cbs->data = puVar1;
  cbs->len = uVar3;
  if (len_len == 0) {
    sVar4 = 0;
  }
  else {
    sVar5 = 0;
    sVar4 = 0;
    do {
      sVar4 = (ulong)puVar2[sVar5] | sVar4 << 8;
      sVar5 = sVar5 + 1;
    } while (len_len != sVar5);
    if (uVar3 < sVar4) {
      return 0;
    }
  }
  cbs->data = puVar1 + sVar4;
  cbs->len = uVar3 - sVar4;
  out->data = puVar1;
  out->len = sVar4;
  return 1;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}